

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O1

void __thiscall
pow_tests::CheckProofOfWork_test_biger_hash_than_target::test_method
          (CheckProofOfWork_test_biger_hash_than_target *this)

{
  uint256 hash_00;
  bool bVar1;
  uint32_t nBits;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  arith_uint256 hash_arith;
  uint256 hash;
  Params consensus;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  assertion_result local_230;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [24];
  __pthread_internal_list *p_Stack_1e0;
  base_uint<256U> local_1d8;
  undefined1 local_1b8 [40];
  undefined1 auStack_190 [80];
  undefined1 local_140 [128];
  uint256 local_c0 [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _List_node_base *local_28;
  
  local_28 = *(_List_node_base **)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)local_1b8,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  local_1b8._32_8_ = *(undefined8 *)local_1b8._0_8_;
  auStack_190._0_8_ = *(undefined8 *)(local_1b8._0_8_ + 8);
  auStack_190._8_8_ = *(undefined8 *)(local_1b8._0_8_ + 0x10);
  auStack_190._16_8_ = *(undefined8 *)(local_1b8._0_8_ + 0x18);
  auStack_190._24_4_ = *(undefined4 *)(local_1b8._0_8_ + 0x20);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
              *)(auStack_190 + 0x20),
             (_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
              *)(local_1b8._0_8_ + 0x28));
  memcpy(local_140,(undefined8 *)(local_1b8._0_8_ + 0x58),0xf9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1b8._0_8_ + 0x158));
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_1b8);
  local_1b8._16_8_ = 0;
  local_1b8._24_8_ = (__pthread_internal_list *)0x0;
  local_1b8._0_8_ = 0;
  local_1b8._8_8_ = 0;
  UintToArith256((arith_uint256 *)&local_1d8,local_c0);
  nBits = arith_uint256::GetCompact((arith_uint256 *)&local_1d8,false);
  base_uint<256U>::operator*=(&local_1d8,2);
  ArithToUint256((uint256 *)local_1f8,(arith_uint256 *)&local_1d8);
  local_1b8._8_8_ = CONCAT71(local_1f8._9_7_,local_1f8[8]);
  local_1b8._16_8_ = local_1f8._16_8_;
  local_1b8._24_8_ = p_Stack_1e0;
  local_1b8._0_8_ = local_1f8._0_8_;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pow_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7b;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  hash_00.super_base_blob<256U>.m_data._M_elems[8] = local_1b8[8];
  hash_00.super_base_blob<256U>.m_data._M_elems[9] = local_1b8[9];
  hash_00.super_base_blob<256U>.m_data._M_elems[10] = local_1b8[10];
  hash_00.super_base_blob<256U>.m_data._M_elems[0xb] = local_1b8[0xb];
  hash_00.super_base_blob<256U>.m_data._M_elems[0xc] = local_1b8[0xc];
  hash_00.super_base_blob<256U>.m_data._M_elems[0xd] = local_1b8[0xd];
  hash_00.super_base_blob<256U>.m_data._M_elems[0xe] = local_1b8[0xe];
  hash_00.super_base_blob<256U>.m_data._M_elems[0xf] = local_1b8[0xf];
  hash_00.super_base_blob<256U>.m_data._M_elems[0] = local_1b8[0];
  hash_00.super_base_blob<256U>.m_data._M_elems[1] = local_1b8[1];
  hash_00.super_base_blob<256U>.m_data._M_elems[2] = local_1b8[2];
  hash_00.super_base_blob<256U>.m_data._M_elems[3] = local_1b8[3];
  hash_00.super_base_blob<256U>.m_data._M_elems[4] = local_1b8[4];
  hash_00.super_base_blob<256U>.m_data._M_elems[5] = local_1b8[5];
  hash_00.super_base_blob<256U>.m_data._M_elems[6] = local_1b8[6];
  hash_00.super_base_blob<256U>.m_data._M_elems[7] = local_1b8[7];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x10] = local_1b8[0x10];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x11] = local_1b8[0x11];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x12] = local_1b8[0x12];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x13] = local_1b8[0x13];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x14] = local_1b8[0x14];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x15] = local_1b8[0x15];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x16] = local_1b8[0x16];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x17] = local_1b8[0x17];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x18] = local_1b8[0x18];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x19] = local_1b8[0x19];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x1a] = local_1b8[0x1a];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x1b] = local_1b8[0x1b];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x1c] = local_1b8[0x1c];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x1d] = local_1b8[0x1d];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x1e] = local_1b8[0x1e];
  hash_00.super_base_blob<256U>.m_data._M_elems[0x1f] = local_1b8[0x1f];
  bVar1 = CheckProofOfWork(hash_00,nBits,(Params *)(local_1b8 + 0x20));
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  p_Stack_1e0 = (__pthread_internal_list *)&local_240;
  local_240 = "!CheckProofOfWork(hash, nBits, consensus)";
  local_238 = "";
  local_1f8[8] = false;
  local_1f8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pow_tests.cpp"
  ;
  local_248 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_1f8,1,0,WARN,(check_type)local_1b8._8_8_,
             (size_t)&local_250,0x7b);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
               *)(auStack_190 + 0x20));
  if (*(_List_node_base **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckProofOfWork_test_biger_hash_than_target)
{
    const auto consensus = CreateChainParams(*m_node.args, ChainType::MAIN)->GetConsensus();
    uint256 hash;
    unsigned int nBits;
    arith_uint256 hash_arith = UintToArith256(consensus.powLimit);
    nBits = hash_arith.GetCompact();
    hash_arith *= 2; // hash > nBits
    hash = ArithToUint256(hash_arith);
    BOOST_CHECK(!CheckProofOfWork(hash, nBits, consensus));
}